

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCache.c
# Opt level: O2

void If_ManCacheAnalize(If_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int Entry;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  Hsh_IntMan_t *p_01;
  Vec_Int_t *pVVar6;
  Vec_Wrd_t *__ptr;
  word *pwVar7;
  ulong uVar8;
  Hsh_IntObj_t *pHVar9;
  uint *puVar10;
  int *piVar11;
  uint *puVar12;
  uint uVar13;
  ulong uVar14;
  int i;
  int *piVar15;
  ulong uVar16;
  long lVar17;
  int i_00;
  ulong uVar18;
  undefined1 auVar19 [16];
  Vec_Int_t *vTest [32];
  
  pVVar6 = p->vCutData;
  p_00 = Vec_IntAlloc(100);
  uVar2 = pVVar6->nSize;
  uVar18 = (long)(int)uVar2 / 4;
  if ((uVar2 & 3) != 0) {
    __assert_fail("Vec_IntSize(vData) % nSize == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                  ,0x162,"Vec_Int_t *Hsh_IntManHashArray(Vec_Int_t *, int)");
  }
  p_01 = (Hsh_IntMan_t *)calloc(1,0x20);
  p_01->nSize = 4;
  p_01->vData = pVVar6;
  uVar2 = (uint)uVar18;
  iVar1 = Abc_PrimeCudd(uVar2);
  pVVar6 = Vec_IntAlloc(iVar1);
  pVVar6->nSize = iVar1;
  if (pVVar6->pArray != (int *)0x0) {
    memset(pVVar6->pArray,0xff,(long)iVar1 << 2);
  }
  p_01->vTable = pVVar6;
  __ptr = (Vec_Wrd_t *)malloc(0x10);
  uVar13 = uVar2;
  if (uVar2 - 1 < 0xf) {
    uVar13 = 0x10;
  }
  __ptr->nSize = 0;
  __ptr->nCap = uVar13;
  if (uVar13 == 0) {
    pwVar7 = (word *)0x0;
  }
  else {
    pwVar7 = (word *)malloc((long)(int)uVar13 << 3);
  }
  __ptr->pArray = pwVar7;
  uVar18 = uVar18 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar18 = 0;
  }
  p_01->vObjs = __ptr;
  uVar16 = 0;
  do {
    if (uVar16 == uVar18) {
      Vec_IntFree(pVVar6);
      free(__ptr->pArray);
      free(__ptr);
      free(p_01);
      for (lVar17 = 0; lVar17 <= p->pPars->nLutSize; lVar17 = lVar17 + 1) {
        pVVar6 = Vec_IntAlloc(1000);
        vTest[lVar17] = pVVar6;
      }
      iVar1 = p_00->nSize;
      i = 0;
      iVar3 = 0;
      if (0 < iVar1) {
        iVar3 = iVar1;
      }
      i_00 = 2;
      for (; iVar3 != i; i = i + 1) {
        Entry = Vec_IntEntry(p_00,i);
        iVar4 = Vec_IntEntry(p->vCutData,i_00);
        Vec_IntPush(vTest[iVar4],Entry);
        i_00 = i_00 + 4;
      }
      if (iVar1 < 2) {
        iVar1 = 1;
      }
      uVar18 = 0;
      while( true ) {
        uVar16 = (ulong)p->pPars->nLutSize;
        if ((long)uVar16 < (long)uVar18) break;
        pVVar6 = vTest[uVar18];
        uVar5 = Vec_IntCountUnique(pVVar6);
        uVar2 = pVVar6->nSize;
        uVar13 = 1;
        if (1 < (int)uVar2) {
          uVar13 = uVar2;
        }
        printf("%2d-var entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n",
               ((double)(int)uVar2 * 100.0) / (double)iVar1,
               ((double)(int)uVar5 * 100.0) / (double)(int)uVar13,uVar18 & 0xffffffff,(ulong)uVar2,
               (ulong)uVar5);
        uVar18 = uVar18 + 1;
      }
      for (lVar17 = 0; lVar17 <= (int)uVar16; lVar17 = lVar17 + 1) {
        Vec_IntFree(vTest[lVar17]);
        uVar16 = (ulong)(uint)p->pPars->nLutSize;
      }
      uVar2 = Vec_IntCountUnique(p_00);
      uVar18 = (long)p->vCutData->nSize / 4;
      iVar3 = (int)uVar18;
      iVar1 = 1;
      if (1 < iVar3) {
        iVar1 = iVar3;
      }
      printf("Total  entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n",
             0x4059000000000000,((double)(int)uVar2 * 100.0) / (double)iVar1,uVar18 & 0xffffffff,
             (ulong)uVar2);
      Vec_IntFree(p_00);
      return;
    }
    if (pVVar6->nSize < __ptr->nSize) {
      uVar2 = Abc_PrimeCudd(pVVar6->nSize * 2);
      Vec_IntGrow(pVVar6,uVar2);
      uVar8 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar8 = 0;
      }
      for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        pVVar6->pArray[uVar14] = -1;
      }
      pVVar6->nSize = uVar2;
      for (iVar1 = 0; iVar1 < __ptr->nSize; iVar1 = iVar1 + 1) {
        pHVar9 = Hsh_IntObj(p_01,iVar1);
        puVar10 = Hsh_IntData(p_01,pHVar9->iData);
        iVar3 = Hsh_IntManHash(puVar10,4,pVVar6->nSize);
        piVar11 = Vec_IntEntryP(pVVar6,iVar3);
        iVar3 = *piVar11;
        pHVar9 = Hsh_IntObj(p_01,iVar1);
        pHVar9->iNext = iVar3;
        *piVar11 = iVar1;
      }
    }
    puVar10 = Hsh_IntData(p_01,(int)uVar16);
    iVar1 = Hsh_IntManHash(puVar10,4,pVVar6->nSize);
    piVar11 = Vec_IntEntryP(pVVar6,iVar1);
    do {
      piVar15 = piVar11;
      pHVar9 = Hsh_IntObj(p_01,*piVar15);
      if (pHVar9 == (Hsh_IntObj_t *)0x0) {
        if (*piVar15 != -1) {
          __assert_fail("*pPlace == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                        ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
        }
        goto LAB_006efca4;
      }
      puVar12 = Hsh_IntData(p_01,pHVar9->iData);
      auVar19[0] = -((char)*puVar10 == (char)*puVar12);
      auVar19[1] = -(*(char *)((long)puVar10 + 1) == *(char *)((long)puVar12 + 1));
      auVar19[2] = -(*(char *)((long)puVar10 + 2) == *(char *)((long)puVar12 + 2));
      auVar19[3] = -(*(char *)((long)puVar10 + 3) == *(char *)((long)puVar12 + 3));
      auVar19[4] = -((char)puVar10[1] == (char)puVar12[1]);
      auVar19[5] = -(*(char *)((long)puVar10 + 5) == *(char *)((long)puVar12 + 5));
      auVar19[6] = -(*(char *)((long)puVar10 + 6) == *(char *)((long)puVar12 + 6));
      auVar19[7] = -(*(char *)((long)puVar10 + 7) == *(char *)((long)puVar12 + 7));
      auVar19[8] = -((char)puVar10[2] == (char)puVar12[2]);
      auVar19[9] = -(*(char *)((long)puVar10 + 9) == *(char *)((long)puVar12 + 9));
      auVar19[10] = -(*(char *)((long)puVar10 + 10) == *(char *)((long)puVar12 + 10));
      auVar19[0xb] = -(*(char *)((long)puVar10 + 0xb) == *(char *)((long)puVar12 + 0xb));
      auVar19[0xc] = -((char)puVar10[3] == (char)puVar12[3]);
      auVar19[0xd] = -(*(char *)((long)puVar10 + 0xd) == *(char *)((long)puVar12 + 0xd));
      auVar19[0xe] = -(*(char *)((long)puVar10 + 0xe) == *(char *)((long)puVar12 + 0xe));
      auVar19[0xf] = -(*(char *)((long)puVar10 + 0xf) == *(char *)((long)puVar12 + 0xf));
      piVar11 = &pHVar9->iNext;
    } while ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar19[0xf] >> 7) << 0xf) != 0xffff);
    if (*piVar15 == -1) {
LAB_006efca4:
      iVar1 = __ptr->nSize;
      *piVar15 = iVar1;
      if (iVar1 == __ptr->nCap) {
        uVar2 = iVar1 * 2;
        if (iVar1 < 0x10) {
          uVar2 = 0x10;
        }
        pwVar7 = __ptr->pArray;
        if (iVar1 < (int)uVar2) {
          if (pwVar7 == (word *)0x0) {
            pwVar7 = (word *)malloc((ulong)uVar2 << 3);
          }
          else {
            pwVar7 = (word *)realloc(pwVar7,(ulong)uVar2 << 3);
          }
          __ptr->pArray = pwVar7;
          if (pwVar7 == (word *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          __ptr->nCap = uVar2;
          iVar1 = __ptr->nSize;
        }
      }
      else {
        pwVar7 = __ptr->pArray;
      }
      __ptr->nSize = iVar1 + 1;
      pwVar7[iVar1] = uVar16 | 0xffffffff00000000;
    }
    else {
      pHVar9 = Hsh_IntObj(p_01,*piVar15);
      iVar1 = (int)((ulong)((long)pHVar9 - (long)__ptr->pArray) >> 3);
    }
    Vec_IntPush(p_00,iVar1);
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void If_ManCacheAnalize( If_Man_t * p )
{
    Vec_Int_t * vRes, * vTest[32];
    int i, Entry, uUnique;
    vRes = Hsh_IntManHashArray( p->vCutData, 4 );
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
        vTest[i] = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vRes, Entry, i )
        Vec_IntPush( vTest[Vec_IntEntry(p->vCutData, 4*i+2)], Entry );
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
    {
        uUnique = Vec_IntCountUnique(vTest[i]);
        printf( "%2d-var entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n", 
            i, Vec_IntSize(vTest[i]), 100.0*Vec_IntSize(vTest[i])/Abc_MaxInt(1, Vec_IntSize(vRes)), 
            uUnique, 100.0*uUnique/Abc_MaxInt(1, Vec_IntSize(vTest[i])) );
    }
    for ( i = 0; i <= p->pPars->nLutSize; i++ )
        Vec_IntFree( vTest[i] );
    uUnique = Vec_IntCountUnique(vRes);
    printf( "Total  entries = %8d. (%6.2f %%)  Unique entries = %8d. (%6.2f %%)\n", 
        Vec_IntSize(p->vCutData)/4, 100.0, uUnique, 100.0*uUnique/Abc_MaxInt(1, Vec_IntSize(p->vCutData)/4) );
    Vec_IntFree( vRes );
}